

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collectjson.cpp
# Opt level: O2

int collectJson(QStringList *jsonFiles,QString *outputFile,bool skipStdIn)

{
  FILE *pFVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Data *__n;
  int __oflag;
  int __oflag_00;
  void *__buf;
  char *pcVar5;
  long lVar6;
  QString *name;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_d0;
  QIODevice local_b8;
  QJsonArray allMetaObjects;
  QJsonDocument doc;
  _Head_base<0UL,_QIODevicePrivate_*,_false> _Stack_90;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<QString> local_60;
  QIODevice local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QHashSeed::setDeterministicGlobalSeed();
  local_48._vptr_QIODevice = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d_ptr._M_t.
  super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
  super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
  super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl =
       (__uniq_ptr_data<QIODevicePrivate,_std::default_delete<QIODevicePrivate>,_true,_true>)
       &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_48);
  if ((outputFile->d).size == 0) {
    iVar3 = QFile::open((QFile *)&local_48,_stdout,2,0);
    pFVar1 = _stderr;
    if ((char)iVar3 != '\0') goto LAB_00106375;
    QIODevice::errorString((QString *)&local_78,&local_48);
    QString::toLocal8Bit((QByteArray *)&local_60,(QString *)&local_78);
    pcVar5 = (char *)local_60.ptr;
    if (local_60.ptr == (QString *)0x0) {
      pcVar5 = &QByteArray::_empty;
    }
    fprintf(pFVar1,"Error opening stdout for writing: %s\n",pcVar5);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  }
  else {
    QFile::setFileName((QFile *)&local_48,outputFile);
    iVar3 = QFile::open((QFile *)&local_48,(char *)0x2,__oflag);
    pFVar1 = _stderr;
    if ((char)iVar3 != '\0') {
LAB_00106375:
      allMetaObjects.a.d.ptr =
           (QExplicitlySharedDataPointer<QCborContainerPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QJsonArray::QJsonArray(&allMetaObjects);
      lVar6 = (jsonFiles->d).size;
      if (lVar6 != 0 || skipStdIn) {
LAB_001063fc:
        __n = (jsonFiles->d).d;
        local_60.ptr = (jsonFiles->d).ptr;
        if (__n != (Data *)0x0) {
          LOCK();
          (__n->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (__n->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        iVar3 = 1;
        local_60.d = __n;
        local_60.size = lVar6;
        QtPrivate::QStringList_sort((QStringList *)&local_60,CaseSensitive);
        name = local_60.ptr;
        for (lVar6 = local_60.size * 0x18; lVar6 != 0; lVar6 = lVar6 + -0x18) {
          local_b8._vptr_QIODevice = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
          local_b8.d_ptr._M_t.
          super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
          super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
          super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl =
               (__uniq_ptr_data<QIODevicePrivate,_std::default_delete<QIODevicePrivate>,_true,_true>
               )&DAT_aaaaaaaaaaaaaaaa;
          QFile::QFile((QFile *)&local_b8,name);
          iVar4 = QFile::open((QFile *)&local_b8,(char *)0x1,__oflag_00);
          pFVar1 = _stderr;
          if ((char)iVar4 == '\0') {
            QString::toLocal8Bit((QByteArray *)&local_78,name);
            if (local_78.ptr == (char16_t *)0x0) {
              local_78.ptr = (char16_t *)&QByteArray::_empty;
            }
            QIODevice::errorString((QString *)&local_d0,&local_b8);
            QString::toLocal8Bit((QByteArray *)&doc,(QString *)&local_d0);
            if ((tuple<QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>)
                _Stack_90._M_head_impl == (_Head_base<0UL,_QIODevicePrivate_*,_false>)0x0) {
              _Stack_90._M_head_impl = (QIODevicePrivate *)&QByteArray::_empty;
            }
            fprintf(pFVar1,"%s: Cannot open file for reading: %s\n",local_78.ptr,
                    _Stack_90._M_head_impl);
            QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&doc);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
            QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
            QFile::~QFile((QFile *)&local_b8);
            goto LAB_001064ea;
          }
          bVar2 = readFromFile((QFile *)&local_b8,&allMetaObjects);
          QFile::~QFile((QFile *)&local_b8);
          if (!bVar2) goto LAB_001064ea;
          name = name + 1;
        }
        doc.d._M_t.
        super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t
        .super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
        super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl =
             (unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>)
             &DAT_aaaaaaaaaaaaaaaa;
        QJsonDocument::QJsonDocument(&doc,&allMetaObjects);
        iVar3 = 0;
        QJsonDocument::toJson((QByteArray *)&local_78,&doc,Indented);
        QIODevice::write(&local_48,(int)&local_78,__buf,(size_t)__n);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
        QJsonDocument::~QJsonDocument(&doc);
LAB_001064ea:
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_60);
      }
      else {
        doc.d._M_t.
        super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t
        .super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
        super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl =
             (unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>)
             &DAT_aaaaaaaaaaaaaaaa;
        _Stack_90._M_head_impl = (QIODevicePrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QFile::QFile((QFile *)&doc);
        iVar3 = 1;
        iVar4 = QFile::open((QFile *)&doc,_stdin,1,0);
        pFVar1 = _stderr;
        if ((char)iVar4 == '\0') {
          QIODevice::errorString((QString *)&local_78,(QIODevice *)&doc);
          QString::toLocal8Bit((QByteArray *)&local_60,(QString *)&local_78);
          pcVar5 = (char *)local_60.ptr;
          if (local_60.ptr == (QString *)0x0) {
            pcVar5 = &QByteArray::_empty;
          }
          fprintf(pFVar1,"Error opening stdin for reading: %s\n",pcVar5);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_60);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
          QFile::~QFile((QFile *)&doc);
        }
        else {
          bVar2 = readFromFile((QFile *)&doc,&allMetaObjects);
          QFile::~QFile((QFile *)&doc);
          if (bVar2) {
            lVar6 = (jsonFiles->d).size;
            goto LAB_001063fc;
          }
        }
      }
      QJsonArray::~QJsonArray(&allMetaObjects);
      goto LAB_001064fe;
    }
    QString::toLocal8Bit((QByteArray *)&local_60,outputFile);
    pcVar5 = (char *)local_60.ptr;
    if (local_60.ptr == (QString *)0x0) {
      pcVar5 = &QByteArray::_empty;
    }
    QIODevice::errorString((QString *)&doc,&local_48);
    QString::toLocal8Bit((QByteArray *)&local_78,(QString *)&doc);
    if (local_78.ptr == (char16_t *)0x0) {
      local_78.ptr = (char16_t *)&QByteArray::_empty;
    }
    fprintf(pFVar1,"%s: Cannot open file for writing: %s\n",pcVar5,local_78.ptr);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&doc);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_60);
  }
  iVar3 = 1;
LAB_001064fe:
  QFile::~QFile((QFile *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int collectJson(const QStringList &jsonFiles, const QString &outputFile, bool skipStdIn)
{
    QHashSeed::setDeterministicGlobalSeed();

    QFile output;
    if (outputFile.isEmpty()) {
        if (!output.open(stdout, QIODevice::WriteOnly)) {
            fprintf(stderr, "Error opening stdout for writing: %s\n",
                    qPrintable(output.errorString()));
            return EXIT_FAILURE;
        }
    } else {
        output.setFileName(outputFile);
        if (!output.open(QIODevice::WriteOnly)) {
            fprintf(stderr, "%s: Cannot open file for writing: %s\n", qPrintable(outputFile),
                    qPrintable(output.errorString()));
            return EXIT_FAILURE;
        }
    }

    QJsonArray allMetaObjects;
    if (jsonFiles.isEmpty() && !skipStdIn) {
        QFile f;
        if (!f.open(stdin, QIODevice::ReadOnly)) {
            fprintf(stderr, "Error opening stdin for reading: %s\n", qPrintable(f.errorString()));
            return EXIT_FAILURE;
        }

        if (!readFromFile(&f, &allMetaObjects))
            return EXIT_FAILURE;
    }

    QStringList jsonFilesSorted = jsonFiles;
    jsonFilesSorted.sort();
    for (const QString &jsonFile : std::as_const(jsonFilesSorted)) {
        QFile f(jsonFile);
        if (!f.open(QIODevice::ReadOnly)) {
            fprintf(stderr, "%s: Cannot open file for reading: %s\n", qPrintable(jsonFile),
                    qPrintable(f.errorString()));
            return EXIT_FAILURE;
        }

        if (!readFromFile(&f, &allMetaObjects))
            return EXIT_FAILURE;
    }

    QJsonDocument doc(allMetaObjects);
    output.write(doc.toJson());

    return EXIT_SUCCESS;
}